

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O3

LY_ERR yin_parse_deviate(lysp_yin_ctx *ctx,lysp_deviate **deviates)

{
  lysp_deviate *plVar1;
  char *value;
  LY_ERR LVar2;
  int iVar3;
  lysp_deviate *parent;
  lysp_deviate *plVar4;
  uint8_t uVar5;
  char *temp_val;
  minmax_dev_meta max;
  minmax_dev_meta min;
  yin_subelement subelems [1];
  char *local_140;
  lysp_deviate *local_138;
  lysp_deviate *local_130;
  lysp_ext_instance *local_128;
  undefined1 *local_120;
  lysp_ext_instance **local_118;
  lysp_ext_instance **local_110;
  yin_subelement local_108;
  undefined4 local_f0;
  lysp_deviate *local_e8;
  undefined2 local_e0;
  undefined4 local_d8;
  lysp_ext_instance **local_d0;
  undefined2 local_c8;
  undefined4 local_c0;
  lysp_deviate *local_b8;
  undefined2 local_b0;
  undefined8 local_a8;
  undefined1 **ppuStack_a0;
  undefined8 local_98;
  undefined4 local_90;
  lysp_deviate *local_88;
  undefined2 local_80;
  undefined4 local_78;
  lysp_ext_instance **local_70;
  undefined2 local_68;
  undefined8 local_60;
  lysp_deviate *plStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  LVar2 = lyxml_ctx_next(ctx->xmlctx);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  LVar2 = yin_parse_attribute(ctx,YIN_ARG_VALUE,&local_140,Y_STR_ARG,LY_STMT_DEVIATE);
  value = local_140;
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  iVar3 = strcmp(local_140,"not-supported");
  if (iVar3 == 0) {
    lydict_remove(ctx->xmlctx->ctx,value);
    parent = (lysp_deviate *)calloc(1,0x18);
    if (parent == (lysp_deviate *)0x0) goto LAB_0018467b;
    local_108._16_8_ = 0;
    local_108.type = LY_STMT_EXTENSION_INSTANCE;
    local_108._4_4_ = 0;
    local_108.dest = (lysp_deviate *)0x0;
    LVar2 = yin_parse_content(ctx,&local_108,1,parent,LY_STMT_DEVIATE,(char **)0x0,&parent->exts);
    uVar5 = '\x01';
  }
  else {
    iVar3 = strcmp(value,"add");
    if (iVar3 == 0) {
      lydict_remove(ctx->xmlctx->ctx,value);
      parent = (lysp_deviate *)calloc(1,0x48);
      if (parent == (lysp_deviate *)0x0) goto LAB_0018467b;
      local_120 = (undefined1 *)((long)&parent[2].next + 4);
      ppuStack_a0 = &local_120;
      local_130 = (lysp_deviate *)&parent[2].next;
      local_128 = (lysp_ext_instance *)&parent->exts;
      local_138 = (lysp_deviate *)&parent[2].exts;
      local_b8 = (lysp_deviate *)&local_138;
      local_108.type = LY_STMT_CONFIG;
      local_108.flags = 2;
      local_f0 = 0x70000;
      local_e8 = parent + 2;
      local_e0 = 0;
      local_d8 = 0x180000;
      local_c8 = 2;
      local_c0 = 0x190000;
      local_b0 = 2;
      local_a8 = CONCAT44(local_a8._4_4_,0x1a0000);
      local_98 = CONCAT62(local_98._2_6_,2);
      local_90 = 0x1d0000;
      local_88 = (lysp_deviate *)&parent[1].next;
      local_80 = 0;
      local_78 = 0x300000;
      local_70 = &parent[1].exts;
      local_68 = 0;
      local_60 = CONCAT44(local_60._4_4_,0x310000);
      plStack_58 = parent + 1;
      local_50 = CONCAT62(local_50._2_6_,2);
      uStack_40 = 0;
      local_38 = 0;
      local_48 = 0xf0000;
      local_118 = (lysp_ext_instance **)local_130;
      local_110 = (lysp_ext_instance **)local_128;
      local_108.dest = local_130;
      local_d0 = (lysp_ext_instance **)local_130;
      LVar2 = yin_parse_content(ctx,&local_108,9,parent,LY_STMT_DEVIATE,(char **)0x0,
                                (lysp_ext_instance **)local_128);
      uVar5 = '\x02';
    }
    else {
      iVar3 = strcmp(value,"replace");
      if (iVar3 == 0) {
        lydict_remove(ctx->xmlctx->ctx,value);
        parent = (lysp_deviate *)calloc(1,0x50);
        if (parent == (lysp_deviate *)0x0) goto LAB_0018467b;
        local_120 = (undefined1 *)((long)&parent[2].exts + 4);
        ppuStack_a0 = &local_120;
        local_130 = (lysp_deviate *)&parent[2].exts;
        local_128 = (lysp_ext_instance *)&parent->exts;
        local_138 = parent + 3;
        local_b8 = (lysp_deviate *)&local_138;
        local_108.type = LY_STMT_CONFIG;
        local_108.flags = 2;
        local_f0 = 0x70000;
        local_e8 = (lysp_deviate *)&parent[1].exts;
        local_e0 = 2;
        local_d8 = 0x180000;
        local_c8 = 2;
        local_c0 = 0x190000;
        local_b0 = 2;
        local_a8 = CONCAT44(local_a8._4_4_,0x1a0000);
        local_98 = CONCAT62(local_98._2_6_,2);
        local_90 = 0x2e0000;
        local_88 = parent + 1;
        local_80 = 2;
        local_78 = 0x310000;
        local_70 = (lysp_ext_instance **)&parent[1].next;
        local_68 = 2;
        plStack_58 = (lysp_deviate *)0x0;
        local_50 = 0;
        local_60 = 0xf0000;
        local_118 = (lysp_ext_instance **)local_130;
        local_110 = (lysp_ext_instance **)local_128;
        local_108.dest = local_130;
        local_d0 = (lysp_ext_instance **)local_130;
        LVar2 = yin_parse_content(ctx,&local_108,8,parent,LY_STMT_DEVIATE,(char **)0x0,
                                  (lysp_ext_instance **)local_128);
        uVar5 = '\x04';
      }
      else {
        iVar3 = strcmp(value,"delete");
        if (iVar3 != 0) {
          ly_vlog((ly_ctx *)
                  **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
                  (char *)0x0,LYVE_SYNTAX_YIN,
                  "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element. Valid values are \"%s\", \"%s\", \"%s\" and \"%s\"."
                  ,value,"value","deviate","not-supported","add","replace","delete");
          lydict_remove(ctx->xmlctx->ctx,local_140);
          return LY_EVALID;
        }
        lydict_remove(ctx->xmlctx->ctx,value);
        parent = (lysp_deviate *)calloc(1,0x38);
        if (parent == (lysp_deviate *)0x0) {
LAB_0018467b:
          ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "yin_parse_deviate");
          return LY_EMEM;
        }
        local_108.type = LY_STMT_DEFAULT;
        local_108.dest = parent + 2;
        local_108._16_8_ = local_108._16_8_ & 0xffffffffffff0000;
        local_f0 = 0x1d0000;
        local_e8 = (lysp_deviate *)&parent[1].next;
        local_e0 = 0;
        local_d8 = 0x300000;
        local_d0 = &parent[1].exts;
        local_c8 = 0;
        local_c0 = 0x310000;
        local_b8 = parent + 1;
        local_b0 = 2;
        ppuStack_a0 = (undefined1 **)0x0;
        local_98 = 0;
        local_a8 = 0xf0000;
        LVar2 = yin_parse_content(ctx,&local_108,5,parent,LY_STMT_DEVIATE,(char **)0x0,&parent->exts
                                 );
        uVar5 = '\x03';
      }
    }
  }
  if ((LVar2 == LY_SUCCESS) &&
     ((parent->exts == (lysp_ext_instance *)0x0 ||
      (LVar2 = ly_set_add(&ctx->main_ctx->ext_inst,parent->exts,'\x01',(uint32_t *)0x0),
      LVar2 == LY_SUCCESS)))) {
    parent->mod = uVar5;
    plVar1 = *deviates;
    if (*deviates == (lysp_deviate *)0x0) {
      *deviates = parent;
    }
    else {
      do {
        plVar4 = plVar1;
        plVar1 = plVar4->next;
      } while (plVar1 != (lysp_deviate *)0x0);
      plVar4->next = parent;
    }
    LVar2 = LY_SUCCESS;
  }
  else {
    free(parent);
  }
  return LVar2;
}

Assistant:

static LY_ERR
yin_parse_deviate(struct lysp_yin_ctx *ctx, struct lysp_deviate **deviates)
{
    LY_ERR ret = LY_SUCCESS;
    uint8_t dev_mod;
    const char *temp_val;
    struct lysp_deviate *d;
    struct lysp_deviate_add *d_add = NULL;
    struct lysp_deviate_rpl *d_rpl = NULL;
    struct lysp_deviate_del *d_del = NULL;

    /* parse argument */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_VALUE, &temp_val, Y_STR_ARG, LY_STMT_DEVIATE));

    if (strcmp(temp_val, "not-supported") == 0) {
        dev_mod = LYS_DEV_NOT_SUPPORTED;
    } else if (strcmp(temp_val, "add") == 0) {
        dev_mod = LYS_DEV_ADD;
    } else if (strcmp(temp_val, "replace") == 0) {
        dev_mod = LYS_DEV_REPLACE;
    } else if (strcmp(temp_val, "delete") == 0) {
        dev_mod = LYS_DEV_DELETE;
    } else {
        LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_INVAL_YIN VALID_VALS4, temp_val, "value", "deviate",
                "not-supported", "add", "replace", "delete");
        lydict_remove(ctx->xmlctx->ctx, temp_val);
        return LY_EVALID;
    }
    lydict_remove(ctx->xmlctx->ctx, temp_val);

    if (dev_mod == LYS_DEV_NOT_SUPPORTED) {
        d = calloc(1, sizeof *d);
        LY_CHECK_ERR_RET(!d, LOGMEM(ctx->xmlctx->ctx), LY_EMEM);
        struct yin_subelement subelems[] = {
            {LY_STMT_EXTENSION_INSTANCE, NULL, 0}
        };

        ret = yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), d, LY_STMT_DEVIATE, NULL, &d->exts);

    } else if (dev_mod == LYS_DEV_ADD) {
        d_add = calloc(1, sizeof *d_add);
        LY_CHECK_ERR_RET(!d_add, LOGMEM(ctx->xmlctx->ctx), LY_EMEM);
        d = (struct lysp_deviate *)d_add;
        struct minmax_dev_meta min = {&d_add->min, &d_add->flags, &d_add->exts};
        struct minmax_dev_meta max = {&d_add->max, &d_add->flags, &d_add->exts};
        struct yin_subelement subelems[] = {
            {LY_STMT_CONFIG, &d_add->flags, YIN_SUBELEM_UNIQUE},
            {LY_STMT_DEFAULT, &d_add->dflts, 0},
            {LY_STMT_MANDATORY, &d_add->flags, YIN_SUBELEM_UNIQUE},
            {LY_STMT_MAX_ELEMENTS, &max, YIN_SUBELEM_UNIQUE},
            {LY_STMT_MIN_ELEMENTS, &min, YIN_SUBELEM_UNIQUE},
            {LY_STMT_MUST, &d_add->musts, 0},
            {LY_STMT_UNIQUE, &d_add->uniques, 0},
            {LY_STMT_UNITS, &d_add->units, YIN_SUBELEM_UNIQUE},
            {LY_STMT_EXTENSION_INSTANCE, NULL, 0},
        };

        ret = yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), d, LY_STMT_DEVIATE, NULL, &d->exts);

    } else if (dev_mod == LYS_DEV_REPLACE) {
        d_rpl = calloc(1, sizeof *d_rpl);
        LY_CHECK_ERR_RET(!d_rpl, LOGMEM(ctx->xmlctx->ctx), LY_EMEM);
        d = (struct lysp_deviate *)d_rpl;
        struct minmax_dev_meta min = {&d_rpl->min, &d_rpl->flags, &d_rpl->exts};
        struct minmax_dev_meta max = {&d_rpl->max, &d_rpl->flags, &d_rpl->exts};
        struct yin_subelement subelems[] = {
            {LY_STMT_CONFIG, &d_rpl->flags, YIN_SUBELEM_UNIQUE},
            {LY_STMT_DEFAULT, &d_rpl->dflt, YIN_SUBELEM_UNIQUE},
            {LY_STMT_MANDATORY, &d_rpl->flags, YIN_SUBELEM_UNIQUE},
            {LY_STMT_MAX_ELEMENTS, &max, YIN_SUBELEM_UNIQUE},
            {LY_STMT_MIN_ELEMENTS, &min, YIN_SUBELEM_UNIQUE},
            {LY_STMT_TYPE, &d_rpl->type, YIN_SUBELEM_UNIQUE},
            {LY_STMT_UNITS, &d_rpl->units, YIN_SUBELEM_UNIQUE},
            {LY_STMT_EXTENSION_INSTANCE, NULL, 0},
        };

        ret = yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), d, LY_STMT_DEVIATE, NULL, &d->exts);

    } else {
        d_del = calloc(1, sizeof *d_del);
        LY_CHECK_ERR_RET(!d_del, LOGMEM(ctx->xmlctx->ctx), LY_EMEM);
        d = (struct lysp_deviate *)d_del;
        struct yin_subelement subelems[] = {
            {LY_STMT_DEFAULT, &d_del->dflts, 0},
            {LY_STMT_MUST, &d_del->musts, 0},
            {LY_STMT_UNIQUE, &d_del->uniques, 0},
            {LY_STMT_UNITS, &d_del->units, YIN_SUBELEM_UNIQUE},
            {LY_STMT_EXTENSION_INSTANCE, NULL, 0},
        };

        ret = yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), d, LY_STMT_DEVIATE, NULL, &d->exts);
    }
    LY_CHECK_GOTO(ret, cleanup);

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_GOTO(ret = yin_unres_exts_add(ctx, d->exts), cleanup);

    d->mod = dev_mod;
    /* insert into siblings */
    LY_LIST_INSERT(deviates, d, next);

    return ret;

cleanup:
    free(d);
    return ret;
}